

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall tinyusdz::MetaVariable::get_value<int>(MetaVariable *this,int *dst)

{
  int *piVar1;
  int *v;
  int *dst_local;
  MetaVariable *this_local;
  
  if (dst == (int *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    piVar1 = tinyusdz::value::Value::as<int>(&this->_value,false);
    if (piVar1 == (int *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      *dst = *piVar1;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *dst) const {
    if (!dst) {
      return false;
    }

    if (const T *v = _value.as<T>()) {
      (*dst) = *v;
      return true;
    }

    return false;
  }